

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.cpp
# Opt level: O0

WorldCoordinates *
KDIS::DATA_TYPE::WorldCoordinates::Lerp
          (WorldCoordinates *__return_storage_ptr__,WorldCoordinates *From,WorldCoordinates *To,
          KFLOAT32 T)

{
  WorldCoordinates local_68;
  WorldCoordinates local_48;
  KFLOAT32 local_24;
  WorldCoordinates *pWStack_20;
  KFLOAT32 T_local;
  WorldCoordinates *To_local;
  WorldCoordinates *From_local;
  
  local_24 = T;
  pWStack_20 = To;
  To_local = From;
  From_local = __return_storage_ptr__;
  operator-(&local_68,To,From);
  operator*(&local_48,&local_68,local_24);
  operator+(__return_storage_ptr__,From,&local_48);
  ~WorldCoordinates(&local_48);
  ~WorldCoordinates(&local_68);
  return __return_storage_ptr__;
}

Assistant:

WorldCoordinates WorldCoordinates::Lerp( const WorldCoordinates & From, const WorldCoordinates & To, KFLOAT32 T )
{
    return From + ( ( To - From ) * T );
}